

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if2ip.c
# Opt level: O0

if2ip_result_t
Curl_if2ip(int af,uint remote_scope,uint param_3,char *interf,char *buf,size_t buf_size)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint ifscope;
  uint scopeid;
  char ipstr [64];
  char scope [12];
  char *ip;
  void *addr;
  ifaddrs *piStack_40;
  if2ip_result_t res;
  ifaddrs *head;
  ifaddrs *iface;
  size_t buf_size_local;
  char *buf_local;
  char *interf_local;
  uint local_10;
  uint local_scope_id_local;
  uint remote_scope_local;
  int af_local;
  
  addr._4_4_ = IF2IP_NOT_FOUND;
  iface = (ifaddrs *)buf_size;
  buf_size_local = (size_t)buf;
  buf_local = interf;
  interf_local._4_4_ = param_3;
  local_10 = remote_scope;
  local_scope_id_local = af;
  iVar1 = getifaddrs(&stack0xffffffffffffffc0);
  if (-1 < iVar1) {
    for (head = piStack_40; head != (ifaddrs *)0x0; head = head->ifa_next) {
      if (head->ifa_addr != (sockaddr *)0x0) {
        if (head->ifa_addr->sa_family == local_scope_id_local) {
          iVar1 = curl_strequal(head->ifa_name,buf_local);
          if (iVar1 != 0) {
            memset(ipstr + 0x3c,0,0xc);
            if (local_scope_id_local != 10) {
              ip = head->ifa_addr->sa_data + 2;
LAB_00159eb9:
              addr._4_4_ = IF2IP_FOUND;
              pcVar3 = inet_ntop(local_scope_id_local,ip,(char *)&ifscope,0x40);
              curl_msnprintf((char *)buf_size_local,(size_t)iface,"%s%s",pcVar3,ipstr + 0x3c);
              break;
            }
            uVar2 = Curl_ipv6_scope(head->ifa_addr);
            if (uVar2 == local_10) {
              ip = head->ifa_addr->sa_data + 6;
              uVar2 = *(uint *)(head->ifa_addr[1].sa_data + 6);
              if ((interf_local._4_4_ == 0) || (uVar2 == interf_local._4_4_)) {
                if (uVar2 != 0) {
                  curl_msnprintf(ipstr + 0x3c,0xc,"%%%u",(ulong)uVar2);
                }
                goto LAB_00159eb9;
              }
              if (addr._4_4_ == IF2IP_NOT_FOUND) {
                addr._4_4_ = IF2IP_AF_NOT_SUPPORTED;
              }
            }
            else if (addr._4_4_ == IF2IP_NOT_FOUND) {
              addr._4_4_ = IF2IP_AF_NOT_SUPPORTED;
            }
          }
        }
        else if ((addr._4_4_ == IF2IP_NOT_FOUND) &&
                (iVar1 = curl_strequal(head->ifa_name,buf_local), iVar1 != 0)) {
          addr._4_4_ = IF2IP_AF_NOT_SUPPORTED;
        }
      }
    }
    freeifaddrs(piStack_40);
  }
  return addr._4_4_;
}

Assistant:

if2ip_result_t Curl_if2ip(int af,
#ifdef USE_IPV6
                          unsigned int remote_scope,
                          unsigned int local_scope_id,
#endif
                          const char *interf,
                          char *buf, size_t buf_size)
{
  struct ifaddrs *iface, *head;
  if2ip_result_t res = IF2IP_NOT_FOUND;

#if defined(USE_IPV6) && \
    !defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  (void) local_scope_id;
#endif

  if(getifaddrs(&head) >= 0) {
    for(iface = head; iface != NULL; iface = iface->ifa_next) {
      if(iface->ifa_addr) {
        if(iface->ifa_addr->sa_family == af) {
          if(strcasecompare(iface->ifa_name, interf)) {
            void *addr;
            const char *ip;
            char scope[12] = "";
            char ipstr[64];
#ifdef USE_IPV6
            if(af == AF_INET6) {
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              unsigned int scopeid = 0;
#endif
              unsigned int ifscope = Curl_ipv6_scope(iface->ifa_addr);

              if(ifscope != remote_scope) {
                /* We are interested only in interface addresses whose scope
                   matches the remote address we want to connect to: global
                   for global, link-local for link-local, etc... */
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;
                continue;
              }

              addr =
                &((struct sockaddr_in6 *)(void *)iface->ifa_addr)->sin6_addr;
#ifdef HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID
              /* Include the scope of this interface as part of the address */
              scopeid = ((struct sockaddr_in6 *)(void *)iface->ifa_addr)
                            ->sin6_scope_id;

              /* If given, scope id should match. */
              if(local_scope_id && scopeid != local_scope_id) {
                if(res == IF2IP_NOT_FOUND)
                  res = IF2IP_AF_NOT_SUPPORTED;

                continue;
              }

              if(scopeid)
                msnprintf(scope, sizeof(scope), "%%%u", scopeid);
#endif
            }
            else
#endif
              addr =
                &((struct sockaddr_in *)(void *)iface->ifa_addr)->sin_addr;
            res = IF2IP_FOUND;
            ip = Curl_inet_ntop(af, addr, ipstr, sizeof(ipstr));
            msnprintf(buf, buf_size, "%s%s", ip, scope);
            break;
          }
        }
        else if((res == IF2IP_NOT_FOUND) &&
                strcasecompare(iface->ifa_name, interf)) {
          res = IF2IP_AF_NOT_SUPPORTED;
        }
      }
    }

    freeifaddrs(head);
  }

  return res;
}